

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

void json_decode_descend(lua_State *l,json_parse_t *json,int slots)

{
  int iVar1;
  int slots_local;
  json_parse_t *json_local;
  lua_State *l_local;
  
  json->current_depth = json->current_depth + 1;
  if ((json->cfg->decode_max_depth < json->current_depth) ||
     (iVar1 = lua_checkstack(l,slots), iVar1 == 0)) {
    strbuf_free(json->tmp);
    luaL_error(l,"Found too many nested data structures (%d) at character %d",
               (ulong)(uint)json->current_depth,(long)json->ptr - (long)json->data);
  }
  return;
}

Assistant:

static void json_decode_descend(lua_State *l, json_parse_t *json, int slots)
{
    json->current_depth++;

    if (json->current_depth <= json->cfg->decode_max_depth &&
        lua_checkstack(l, slots)) {
        return;
    }

    strbuf_free(json->tmp);
    luaL_error(l, "Found too many nested data structures (%d) at character %d",
        json->current_depth, json->ptr - json->data);
}